

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

Abc_Cex_t * Gia_Sim2GenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat)

{
  int iVar1;
  int nRealPis;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  uint *p_00;
  int local_40;
  int local_3c;
  int Counter;
  int w;
  int i;
  int f;
  uint *pData;
  Abc_Cex_t *p;
  int iPat_local;
  int nWords_local;
  int iOut_local;
  int iFrame_local;
  Gia_Man_t *pAig_local;
  
  iVar1 = Gia_ManRegNum(pAig);
  nRealPis = Gia_ManPiNum(pAig);
  pAVar3 = Abc_CexAlloc(iVar1,nRealPis,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  local_40 = pAVar3->nRegs;
  p_00 = (uint *)malloc((long)nWords << 2);
  for (w = 0; w <= iFrame; w = w + 1) {
    for (Counter = 0; iVar1 = Gia_ManPiNum(pAig), Counter < iVar1; Counter = Counter + 1) {
      for (local_3c = nWords + -1; -1 < local_3c; local_3c = local_3c + -1) {
        uVar2 = Gia_ManRandom(0);
        p_00[local_3c] = uVar2;
      }
      iVar1 = Abc_InfoHasBit(p_00,iPat);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)(pAVar3 + 1),local_40 + Counter);
      }
    }
    local_40 = pAVar3->nPis + local_40;
  }
  if (p_00 != (uint *)0x0) {
    free(p_00);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_Sim2GenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + i );
    }
    ABC_FREE( pData );
    return p;
}